

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::PageSegmentBase
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,
          PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          *allocator,void *address,uint pageCount,uint committedCount,bool enableWriteBarrier)

{
  bool enableWriteBarrier_local;
  uint committedCount_local;
  uint pageCount_local;
  void *address_local;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *allocator_local;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  SegmentBase<Memory::PreReservedVirtualAllocWrapper>::SegmentBase
            (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>,allocator,
             (ulong)allocator->maxAllocPageCount,enableWriteBarrier);
  BVStatic<272UL>::BVStatic(&this->freePages);
  BVStatic<272UL>::BVStatic(&this->decommitPages);
  this->freePageCount = 0;
  this->decommitPageCount = 0;
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).field_0x2c =
       (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).field_0x2c & 0xfb | 4;
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address = (char *)address;
  (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).segmentPageCount =
       (ulong)pageCount;
  return;
}

Assistant:

PageSegmentBase<T>::PageSegmentBase(PageAllocatorBase<T> * allocator, void* address, uint pageCount, uint committedCount, bool enableWriteBarrier) :
    SegmentBase<T>(allocator, allocator->maxAllocPageCount, enableWriteBarrier), decommitPageCount(0), freePageCount(0)
{
#if DBG
    this->isPageSegment = true;
#endif // DBG
    this->address = (char*)address;
    this->segmentPageCount = pageCount;
}